

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.h
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl::PORT_USERDATA::waitForFrame(PORT_USERDATA *this)

{
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->_mutex);
  this->wantToGrab = true;
  ThreadCondition::Wait(&this->Thcond,&local_20);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void waitForFrame() {
                    //_mutex.lock();
                    std::unique_lock<std::mutex> lck ( _mutex );

                    wantToGrab=true;
//                    _mutex.unlock();
//                    Thcond.Wait();
                       Thcond.Wait(lck); //this will unlock the mutex and wait atomically
                }